

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void fts5ExprNodeTest_OR(Fts5Expr *pExpr,Fts5ExprNode *pNode)

{
  Fts5ExprNode *p2;
  int iVar1;
  int cmp;
  Fts5ExprNode *pChild;
  Fts5ExprNode *pFStack_20;
  int i;
  Fts5ExprNode *pNext;
  Fts5ExprNode *pNode_local;
  Fts5Expr *pExpr_local;
  
  pFStack_20 = pNode->apChild[0];
  for (pChild._4_4_ = 1; pChild._4_4_ < pNode->nChild; pChild._4_4_ = pChild._4_4_ + 1) {
    p2 = pNode->apChild[pChild._4_4_];
    iVar1 = fts5NodeCompare(pExpr,pFStack_20,p2);
    if ((0 < iVar1) || ((iVar1 == 0 && (p2->bNomatch == 0)))) {
      pFStack_20 = p2;
    }
  }
  pNode->iRowid = pFStack_20->iRowid;
  pNode->bEof = pFStack_20->bEof;
  pNode->bNomatch = pFStack_20->bNomatch;
  return;
}

Assistant:

static void fts5ExprNodeTest_OR(
  Fts5Expr *pExpr,                /* Expression of which pNode is a part */
  Fts5ExprNode *pNode             /* Expression node to test */
){
  Fts5ExprNode *pNext = pNode->apChild[0];
  int i;

  for(i=1; i<pNode->nChild; i++){
    Fts5ExprNode *pChild = pNode->apChild[i];
    int cmp = fts5NodeCompare(pExpr, pNext, pChild);
    if( cmp>0 || (cmp==0 && pChild->bNomatch==0) ){
      pNext = pChild;
    }
  }
  pNode->iRowid = pNext->iRowid;
  pNode->bEof = pNext->bEof;
  pNode->bNomatch = pNext->bNomatch;
}